

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O2

int ps_config_validate(ps_config_t *config)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  long lVar6;
  
  bVar1 = false;
  for (lVar6 = 0; lVar6 != 0x38; lVar6 = lVar6 + 8) {
    pcVar3 = ps_config_str(config,*(char **)((long)searches + lVar6));
    bVar2 = bVar1;
    if ((pcVar3 != (char *)0x0) && (bVar2 = true, bVar1)) goto LAB_0010c51a;
    bVar1 = bVar2;
  }
  iVar5 = 0;
  if (true < bVar1) {
LAB_0010c51a:
    iVar5 = 0xc;
    for (lVar6 = 0; lVar6 != 0x38; lVar6 = lVar6 + 8) {
      sVar4 = strlen(*(char **)((long)searches + lVar6));
      iVar5 = iVar5 + (int)sVar4 + 2;
    }
    pcVar3 = (char *)__ckd_malloc__((long)(iVar5 + 0x24),
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                    ,0x97);
    builtin_strncpy(pcVar3,"Only one of ",0xd);
    for (lVar6 = 0; lVar6 != 0x38; lVar6 = lVar6 + 8) {
      strcat(pcVar3,*(char **)((long)searches + lVar6));
      sVar4 = strlen(pcVar3);
      (pcVar3 + sVar4)[0] = ',';
      (pcVar3 + sVar4)[1] = ' ';
      pcVar3[sVar4 + 2] = '\0';
    }
    sVar4 = strlen(pcVar3);
    builtin_strncpy(pcVar3 + sVar4,"can be enabled at a time in config\n",0x24);
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x9e,pcVar3);
    ckd_free(pcVar3);
    iVar5 = -1;
  }
  return iVar5;
}

Assistant:

int
ps_config_validate(ps_config_t *config)
{
    int i, found = 0;
    for (i = 0; i < nsearches; ++i) {
        if (ps_config_str(config, searches[i]) != NULL)
            if (++found > 1)
                break;
    }
    if (found > 1) {
        int len = strlen("Only one of ");
        char *msg;
        for (i = 0; i < nsearches; ++i)
            len += strlen(searches[i]) + 2;
        len += strlen("can be enabled at a time in config\n");
        msg = ckd_malloc(len + 1);
        strcpy(msg, "Only one of ");
        for (i = 0; i < nsearches; ++i) {
            strcat(msg, searches[i]);
            strcat(msg, ", ");
        }
        strcat(msg, "can be enabled at a time in config\n");
        E_ERROR(msg);
        ckd_free(msg);
        return -1;
    }
    return 0;
}